

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_artifact_flags(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  parser_error pVar3;
  void *pvVar4;
  char *pcVar5;
  char *flag_name;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar3 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar5 = parser_getstr(p,"flags");
      pcVar5 = string_make(pcVar5);
      flag_name = strtok(pcVar5," |");
      while (flag_name != (char *)0x0) {
        eVar2 = grab_flag((bitflag *)((long)pvVar4 + 0x48),5,obj_flags,flag_name);
        _Var1 = grab_element_flag((element_info *)((long)pvVar4 + 0x90),flag_name);
        if (!_Var1 && eVar2 != 0) goto LAB_00188c1a;
        flag_name = strtok((char *)0x0," |");
      }
      flag_name = (char *)0x0;
LAB_00188c1a:
      string_free(pcVar5);
      pVar3 = PARSE_ERROR_INVALID_FLAG;
      if (flag_name == (char *)0x0) {
        pVar3 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_artifact_flags(struct parser *p) {
	struct artifact *a = parser_priv(p);
	char *s, *t;

	if (!a) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "flags")) {
		return PARSE_ERROR_NONE;
	}
	s = string_make(parser_getstr(p, "flags"));
	t = strtok(s, " |");
	while (t) {
		bool found = false;
		if (!grab_flag(a->flags, OF_SIZE, obj_flags, t)) {
			found = true;
		}
		if (grab_element_flag(a->el_info, t)) {
			found = true;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}
	string_free(s);
	return t ? PARSE_ERROR_INVALID_FLAG : PARSE_ERROR_NONE;
}